

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall AggressiveBotStrategy::reinforceArmyCount(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  Country *pCVar4;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar3 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 != ppCVar2) {
    pCVar4 = (Country *)0x0;
    do {
      if ((pCVar4 == (Country *)0x0) || (*pCVar4->pNumberOfTroops < *(*ppCVar3)->pNumberOfTroops)) {
        pCVar4 = *ppCVar3;
      }
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 != ppCVar2);
    if ((pCVar4 != (Country *)0x0) && (*pCVar4->cyID == *((this->super_PlayerStrategy).to)->cyID)) {
      std::ostream::operator<<(&std::cout,*(this->super_PlayerStrategy).armiesToPlace);
      return *(this->super_PlayerStrategy).armiesToPlace;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0",1);
  return 0;
}

Assistant:

int AggressiveBotStrategy::reinforceArmyCount() {
    Map::Country* biggest = nullptr;
    for (auto* country : *player->getOwnedCountries()) {
        if (biggest == nullptr || country->getNumberOfTroops() > biggest->getNumberOfTroops()) {
            biggest = country;
        }
    }

    if (biggest != nullptr && biggest->getCountryId() == to->getCountryId()) {
        std::cout << *armiesToPlace;
        return *armiesToPlace;
    }
    std::cout << "0";
    return 0;
}